

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O1

Float pbrt::OwenScrambledRadicalInverse(int baseIndex,uint64_t a,uint32_t hash)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint32_t w;
  ulong uVar10;
  float fVar11;
  undefined1 in_XMM4 [16];
  
  uVar1 = (&Primes)[baseIndex];
  uVar4 = (ulong)(int)uVar1;
  fVar11 = 1.0;
  uVar5 = uVar1 - 1 >> 1 | uVar1 - 1;
  uVar5 = uVar5 >> 2 | uVar5;
  uVar5 = uVar5 >> 4 | uVar5;
  uVar5 = uVar5 >> 8 | uVar5;
  uVar5 = uVar5 >> 0x10 | uVar5;
  uVar10 = 0;
  do {
    uVar6 = a % uVar4;
    uVar8 = ((uVar10 ^ hash) >> 0x1f ^ uVar10 ^ hash) * 0x7fb5d329728ea185;
    lVar9 = (uVar8 >> 0x1b ^ uVar8) * -0x7e25210b43d22bb3;
    uVar7 = (uint)((ulong)lVar9 >> 0x21) ^ (uint)lVar9;
    do {
      uVar3 = ((uint)uVar6 ^ uVar7) * -0x1e8f76c3 ^ uVar7 >> 0x10;
      uVar3 = ((uVar3 & uVar5) >> 4 ^ uVar7 >> 8 ^ uVar3) * 0x929eb3f ^ uVar7 >> 0x17;
      uVar3 = ((uVar3 & uVar5) >> 1 ^ uVar3) * (uVar7 >> 0x1b | 1) * 0x6935fa69;
      uVar3 = ((uVar3 & uVar5) >> 0xb ^ uVar3) * 0x74dcb303;
      uVar3 = ((uVar3 & uVar5) >> 2 ^ uVar3) * -0x61afe33d;
      uVar3 = ((uVar3 & uVar5) >> 2 ^ uVar3) * -0x379f5c21 & uVar5;
      uVar3 = uVar3 >> 5 ^ uVar3;
      uVar6 = (ulong)uVar3;
    } while (uVar1 <= uVar3);
    uVar10 = (long)(int)((uVar3 + uVar7) % uVar1) + uVar10 * uVar4;
    fVar11 = (1.0 / (float)(int)uVar1) * fVar11;
    a = a / uVar4;
  } while (1.0 - fVar11 < 1.0);
  auVar2 = vcvtusi2ss_avx512f(in_XMM4,uVar10);
  auVar2 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar11 * auVar2._0_4_)));
  return auVar2._0_4_;
}

Assistant:

PBRT_CPU_GPU inline Float OwenScrambledRadicalInverse(int baseIndex, uint64_t a,
                                                      uint32_t hash) {
    int base = Primes[baseIndex];
    Float invBase = (Float)1 / (Float)base, invBaseN = 1;
    uint64_t reversedDigits = 0;
    int digitIndex = 0;
    while (1 - invBaseN < 1) {
        uint64_t next = a / base;
        int digitValue = a - next * base;
        uint32_t digitHash = MixBits(hash ^ reversedDigits);
        digitValue = PermutationElement(digitValue, base, digitHash);
        reversedDigits = reversedDigits * base + digitValue;
        invBaseN *= invBase;
        ++digitIndex;
        a = next;
    }
    return std::min(invBaseN * reversedDigits, OneMinusEpsilon);
}